

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestCaseFilter::isMatch(TestCaseFilter *this,TestCase *testCase)

{
  TestCaseInfo *pTVar1;
  logic_error *this_00;
  string local_40 [8];
  string name;
  TestCase *testCase_local;
  TestCaseFilter *this_local;
  
  pTVar1 = TestCase::getTestCaseInfo(testCase);
  std::__cxx11::string::string(local_40,(string *)pTVar1);
  toLowerInPlace((string *)local_40);
  switch(this->m_wildcardPosition) {
  case NoWildcard:
    this_local._7_1_ =
         std::operator==(&this->m_stringToMatch,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
    break;
  case WildcardAtStart:
    this_local._7_1_ = endsWith((string *)local_40,&this->m_stringToMatch);
    break;
  case WildcardAtEnd:
    this_local._7_1_ = startsWith((string *)local_40,&this->m_stringToMatch);
    break;
  case WildcardAtBothEnds:
    this_local._7_1_ = contains((string *)local_40,&this->m_stringToMatch);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unhandled wildcard type");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::~string(local_40);
  return this_local._7_1_;
}

Assistant:

bool isMatch( TestCase const& testCase ) const {
            std::string name = testCase.getTestCaseInfo().name;
            toLowerInPlace( name );

            switch( m_wildcardPosition ) {
                case NoWildcard:
                    return m_stringToMatch == name;
                case WildcardAtStart:
                    return endsWith( name, m_stringToMatch );
                case WildcardAtEnd:
                    return startsWith( name, m_stringToMatch );
                case WildcardAtBothEnds:
                    return contains( name, m_stringToMatch );
            }
            throw std::logic_error( "Unhandled wildcard type" );
        }